

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O0

void __thiscall Assimp::Collada::Node::Node(Node *this)

{
  Node *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->mID);
  std::__cxx11::string::string((string *)&this->mSID);
  this->mParent = (Node *)0x0;
  std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::vector
            (&this->mChildren);
  std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::vector
            (&this->mTransforms);
  std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>::vector
            (&this->mMeshes);
  std::vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>::
  vector(&this->mLights);
  std::vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>::
  vector(&this->mCameras);
  std::vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>::vector
            (&this->mNodeInstances);
  std::__cxx11::string::string((string *)&this->mPrimaryCamera);
  return;
}

Assistant:

Node()
    : mParent( nullptr ){
        // empty
    }